

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::EscapePhpdoc
                   (string *__return_storage_ptr__,string *input)

{
  byte bVar1;
  string *psVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    psVar2 = (string *)0x2a;
    uVar3 = 0;
    do {
      bVar1 = (input->_M_dataplus)._M_p[uVar3];
      if (bVar1 == 0x40) {
LAB_0027c7a5:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if (bVar1 == 0x2f) {
          if ((char)psVar2 == '*') goto LAB_0027c7a5;
        }
        else if ((bVar1 == 0x2a) && ((char)psVar2 == '/')) goto LAB_0027c7a5;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar3 = uVar3 + 1;
      psVar2 = (string *)(ulong)(uint)bVar1;
    } while (uVar3 < input->_M_string_length);
  }
  return psVar2;
}

Assistant:

static std::string EscapePhpdoc(const std::string& input) {
  std::string result;
  result.reserve(input.size() * 2);

  char prev = '*';

  for (std::string::size_type i = 0; i < input.size(); i++) {
    char c = input[i];
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      case '@':
        // '@' starts phpdoc tags including the @deprecated tag, which will
        // cause a compile-time error if inserted before a declaration that
        // does not have a corresponding @Deprecated annotation.
        result.append("&#64;");
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}